

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LuaException.h
# Opt level: O3

void __thiscall luabridge::LuaException::~LuaException(LuaException *this)

{
  ~LuaException(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~LuaException() throw() {}